

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O3

void llb_build_value_get_file_infos
               (llb_build_value *value,void *context,
               _func_void_void_ptr_llb_build_value_file_info_t *iterator)

{
  uint uVar1;
  llb_build_value_file_info_t lVar2;
  FileInfo *pFVar3;
  uint n;
  
  if ((*(uint *)value < 0x12) && ((0x20414U >> (*(uint *)value & 0x1f) & 1) != 0)) {
    uVar1 = *(uint *)(value + 4);
    if (uVar1 != 0) {
      n = 0;
      do {
        pFVar3 = llbuild::buildsystem::BuildValue::getNthOutputInfo((BuildValue *)value,n);
        lVar2.device = pFVar3->device;
        lVar2.inode = pFVar3->inode;
        lVar2.mode = pFVar3->mode;
        lVar2.size = pFVar3->size;
        lVar2.modTime.seconds = (pFVar3->modTime).seconds;
        lVar2.modTime.nanoseconds = (pFVar3->modTime).nanoseconds;
        (*iterator)(context,lVar2);
        n = n + 1;
      } while (uVar1 != n);
    }
    return;
  }
  __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0x186,"unsigned int llbuild::buildsystem::BuildValue::getNumOutputs() const");
}

Assistant:

void llb_build_value_get_file_infos(llb_build_value *_Nonnull value, void *_Nullable context, void (*_Nonnull iterator)(void *_Nullable context, llb_build_value_file_info_t fileInfo)) {
  auto internalBuildValue = &((CAPIBuildValue *)value)->getInternalBuildValue();
  auto count = internalBuildValue->getNumOutputs();
  for (unsigned index = 0; index < count; index++) {
    auto fileInfo = internalBuildValue->getNthOutputInfo(index);
    iterator(context, llbuild::capi::convertFileInfo(fileInfo));
  }
}